

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

Vec_Int_t * Gia_RsbCiWindow(Gia_Man_t *p,int nPis)

{
  void *__ptr;
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *vMap;
  Vec_Wec_t *vLevels;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  int *local_40;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  iVar6 = p->nObjs;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar2 = iVar6;
  }
  vMap->nCap = iVar2;
  if (iVar2 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = iVar6;
LAB_007af4a4:
    local_40 = (int *)0x0;
  }
  else {
    local_40 = (int *)malloc((long)iVar2 << 2);
    vMap->pArray = local_40;
    vMap->nSize = iVar6;
    if (local_40 == (int *)0x0) goto LAB_007af4a4;
    memset(local_40,0xff,(long)iVar6 << 2);
  }
  uVar1 = Gia_ManLevelNum(p);
  vLevels = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < uVar1) {
    iVar6 = uVar1 + 1;
  }
  vLevels->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  vLevels->pArray = pVVar4;
  vLevels->nSize = uVar1 + 1;
  Gia_ManStaticFanoutStart(p);
  Gia_ManIncrementTravId(p);
  uVar1 = Gia_WinAddCiWithMaxFanouts(p);
  if (p->nTravIdsAlloc <= (int)uVar1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  p->pTravIds[uVar1] = p->nTravIds;
  Vec_IntPush(p_00,uVar1);
  if (1 < nPis) {
    iVar6 = nPis + -1;
    do {
      iVar2 = Gia_WinAddCiWithMaxDivisors(p,vLevels);
      Gia_WinTryAddingNode(p,iVar2,-1,vLevels,p_00);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  pVVar5 = Gia_RsbCiTranslate(p,p_00,vMap);
  Gia_ManStaticFanoutStop(p);
  iVar6 = vLevels->nCap;
  pVVar4 = vLevels->pArray;
  if ((long)iVar6 < 1) {
    if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007af5e2;
  }
  else {
    lVar7 = 0;
    do {
      __ptr = *(void **)((long)&pVVar4->pArray + lVar7);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar4->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar7);
  }
  free(pVVar4);
LAB_007af5e2:
  free(vLevels);
  if (local_40 != (int *)0x0) {
    free(local_40);
  }
  free(vMap);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_RsbCiWindow( Gia_Man_t * p, int nPis )
{
    Vec_Int_t * vRes;  int i, iMaxFan;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap    = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Wec_t * vLevels = Vec_WecStart( Gia_ManLevelNum(p)+1 );
    Gia_ManStaticFanoutStart( p );
    Gia_ManIncrementTravId(p);
    // add the first one
    iMaxFan = Gia_WinAddCiWithMaxFanouts( p );
    Gia_ObjSetTravIdCurrentId( p, iMaxFan );
    Vec_IntPush( vNodes, iMaxFan );
    // add remaining ones
    for ( i = 1; i < nPis; i++ )
    {
        iMaxFan = Gia_WinAddCiWithMaxDivisors( p, vLevels );
        Gia_WinTryAddingNode( p, iMaxFan, -1, vLevels, vNodes );
    }
    Vec_IntSort( vNodes, 0 );
    vRes = Gia_RsbCiTranslate( p, vNodes, vMap );
    Gia_ManStaticFanoutStop( p );
    Vec_WecFree( vLevels );
    Vec_IntFree( vMap );
//Vec_IntPrint( vNodes );
    Vec_IntFree( vNodes );
    return vRes;
}